

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmPropertyDefinition.cxx
# Opt level: O1

void __thiscall
cmPropertyDefinition::DefineProperty
          (cmPropertyDefinition *this,string *name,ScopeType scope,char *shortDescription,
          char *fullDescription,bool chain)

{
  char *pcVar1;
  
  std::__cxx11::string::_M_assign((string *)this);
  this->Scope = scope;
  this->Chained = chain;
  if (shortDescription != (char *)0x0) {
    pcVar1 = (char *)(this->ShortDescription)._M_string_length;
    strlen(shortDescription);
    std::__cxx11::string::_M_replace
              ((ulong)&this->ShortDescription,0,pcVar1,(ulong)shortDescription);
  }
  if (fullDescription != (char *)0x0) {
    pcVar1 = (char *)(this->FullDescription)._M_string_length;
    strlen(fullDescription);
    std::__cxx11::string::_M_replace((ulong)&this->FullDescription,0,pcVar1,(ulong)fullDescription);
    return;
  }
  return;
}

Assistant:

void cmPropertyDefinition
::DefineProperty(const std::string& name, cmProperty::ScopeType scope,
                 const char *shortDescription,
                 const char *fullDescription,
                 bool chain)
{
  this->Name = name;
  this->Scope = scope;
  this->Chained = chain;
  if (shortDescription)
    {
    this->ShortDescription = shortDescription;
    }
  if (fullDescription)
    {
    this->FullDescription = fullDescription;
    }
}